

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O2

void skiwi::compile_max_2(asmcode *code,compiler_options *ops)

{
  skiwi *psVar1;
  uint64_t lab;
  uint64_t lab_00;
  uint64_t lab_01;
  uint64_t lab_02;
  uint64_t lab_03;
  uint64_t lab_04;
  operand oVar2;
  operand local_fc;
  operand local_f8 [4];
  string done_fx;
  string error;
  string done;
  string l1;
  string l3;
  string l2;
  
  l1._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,char_const(&)[8]>
            (code,(operation *)&l1,(char (*) [8])"L_max_2");
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&l1,psVar1,lab);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&l2,psVar1,lab_00);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&l3,psVar1,lab_01);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&done,psVar1,lab_02);
  psVar1 = label;
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  if (ops->safe_primitives == true) {
    label = label + 1;
    label_to_string_abi_cxx11_(&done_fx,psVar1,lab_03);
    std::__cxx11::string::operator=((string *)&error,(string *)&done_fx);
    std::__cxx11::string::~string((string *)&done_fx);
  }
  done_fx._M_dataplus._M_p._0_4_ = 0x5a;
  local_f8[0] = 9;
  local_fc = NUMBER;
  local_f8[2] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&done_fx,local_f8,&local_fc,(int *)(local_f8 + 2));
  if (ops->safe_primitives == true) {
    done_fx._M_dataplus._M_p._0_4_ = 0x2f;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&done_fx,&l1);
  }
  else {
    done_fx._M_dataplus._M_p._0_4_ = 0x38;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&done_fx,&l1);
  }
  done_fx._M_dataplus._M_p._0_4_ = 0x5a;
  local_f8[0] = 10;
  local_fc = NUMBER;
  local_f8[2] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&done_fx,local_f8,&local_fc,(int *)(local_f8 + 2));
  if (ops->safe_primitives == true) {
    done_fx._M_dataplus._M_p._0_4_ = 0x2f;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&done_fx,&l3);
  }
  else {
    done_fx._M_dataplus._M_p._0_4_ = 0x38;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&done_fx,&l3);
  }
  if (ops->safe_primitives == true) {
    done_fx._M_dataplus._M_p._0_4_ = 0x4b;
    local_f8[0] = 0x14;
    assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
              (code,(operation *)&done_fx,local_f8);
    jump_if_arg_is_not_block(code,RAX,R11,&error);
    jump_if_arg_is_not_block(code,RBX,R11,&error);
  }
  local_f8[0] = AH;
  local_fc = RAX;
  local_f8[2] = 0x39;
  done_fx._M_dataplus._M_p = (pointer)0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_f8,&local_fc,local_f8 + 2,(unsigned_long *)&done_fx);
  local_f8[0] = AH;
  local_fc = RBX;
  local_f8[2] = 0x39;
  done_fx._M_dataplus._M_p = (pointer)0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_f8,&local_fc,local_f8 + 2,(unsigned_long *)&done_fx);
  if (ops->safe_primitives == true) {
    jump_if_arg_does_not_point_to_flonum(code,RAX,R11,&error);
    jump_if_arg_does_not_point_to_flonum(code,RBX,R11,&error);
    done_fx._M_dataplus._M_p._0_4_ = 0x4a;
    local_f8[0] = R11;
    assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
              (code,(operation *)&done_fx,local_f8);
  }
  oVar2 = XMM0;
  done_fx._M_dataplus._M_p._0_4_ = 0x43;
  local_f8[0] = XMM0;
  local_fc = MEM_RAX;
  local_f8[2] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&done_fx,local_f8,&local_fc,(int *)(local_f8 + 2));
  done_fx._M_dataplus._M_p._0_4_ = 0x43;
  local_f8[0] = XMM1;
  local_fc = MEM_RBX;
  local_f8[2] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&done_fx,local_f8,&local_fc,(int *)(local_f8 + 2));
  done_fx._M_dataplus._M_p._0_4_ = 0x5b;
  local_f8[0] = 0x43;
  local_fc = XMM1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&done_fx,local_f8,&local_fc);
  if (ops->safe_primitives == true) {
    done_fx._M_dataplus._M_p._0_4_ = 0x2d;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&done_fx,&done);
  }
  else {
    done_fx._M_dataplus._M_p._0_4_ = 0x36;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&done_fx,&done);
  }
  done_fx._M_dataplus._M_p._0_4_ = 0x43;
  local_f8[0] = 0x43;
  local_fc = XMM1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&done_fx,local_f8,&local_fc);
  if (ops->safe_primitives == true) {
    done_fx._M_dataplus._M_p._0_4_ = 0x2c;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&done_fx,&done);
  }
  else {
    done_fx._M_dataplus._M_p._0_4_ = 0x35;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&done_fx,&done);
  }
  done_fx._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&done_fx,&l1);
  done_fx._M_dataplus._M_p._0_4_ = 0x5a;
  local_f8[0] = RBX;
  local_fc = NUMBER;
  local_f8[2] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&done_fx,local_f8,&local_fc,(int *)(local_f8 + 2));
  done_fx._M_dataplus._M_p._0_4_ = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&done_fx,&l2);
  fix2int(code,RAX);
  done_fx._M_dataplus._M_p._0_4_ = 0xb;
  local_f8[0] = XMM0;
  local_fc = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&done_fx,local_f8,&local_fc);
  if (ops->safe_primitives == true) {
    done_fx._M_dataplus._M_p._0_4_ = 0x4b;
    local_f8[0] = R11;
    assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
              (code,(operation *)&done_fx,local_f8);
    jump_if_arg_is_not_block(code,RBX,R11,&error);
  }
  local_f8[0] = AH;
  local_fc = RBX;
  local_f8[2] = 0x39;
  done_fx._M_dataplus._M_p = (pointer)0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_f8,&local_fc,local_f8 + 2,(unsigned_long *)&done_fx);
  if (ops->safe_primitives == true) {
    jump_if_arg_does_not_point_to_flonum(code,RBX,R11,&error);
    done_fx._M_dataplus._M_p._0_4_ = 0x4a;
    local_f8[0] = R11;
    assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
              (code,(operation *)&done_fx,local_f8);
  }
  done_fx._M_dataplus._M_p._0_4_ = 0x43;
  local_f8[0] = XMM1;
  local_fc = MEM_RBX;
  local_f8[2] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&done_fx,local_f8,&local_fc,(int *)(local_f8 + 2));
  done_fx._M_dataplus._M_p._0_4_ = 0x5b;
  local_f8[0] = XMM0;
  local_fc = XMM1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&done_fx,local_f8,&local_fc);
  done_fx._M_dataplus._M_p._0_4_ = 0x36;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&done_fx,&done);
  done_fx._M_dataplus._M_p._0_4_ = 0x43;
  local_f8[0] = XMM0;
  local_fc = XMM1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&done_fx,local_f8,&local_fc);
  done_fx._M_dataplus._M_p._0_4_ = 0x35;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&done_fx,&done);
  done_fx._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&done_fx,&l2);
  done_fx._M_dataplus._M_p._0_4_ = 5;
  local_f8[0] = RAX;
  local_fc = RBX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&done_fx,local_f8,&local_fc);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&done_fx,psVar1,lab_04);
  local_f8[0] = ST1;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_f8,&done_fx);
  local_f8[0] = ST6;
  local_fc = RAX;
  local_f8[2] = 10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_f8,&local_fc,local_f8 + 2);
  local_f8[0] = ST4;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_f8,&done_fx);
  local_f8[0] = XMM9;
  assembler::asmcode::add<assembler::asmcode::operation>(code,local_f8);
  local_f8[0] = BYTE_MEM_R12;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>(code,local_f8,&done);
  local_f8[0] = ST4;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>(code,local_f8,&l3);
  if (ops->safe_primitives == true) {
    local_f8[0] = 0x4b;
    local_fc = R11;
    assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
              (code,local_f8,&local_fc);
    jump_short_if_arg_is_not_block(code,RAX,R11,&error);
  }
  local_fc = AH;
  local_f8[2] = 9;
  local_f8[3] = 0x39;
  local_f8[0] = ~DL;
  local_f8[1] = ~EMPTY;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,&local_fc,local_f8 + 2,local_f8 + 3,(unsigned_long *)local_f8);
  if (ops->safe_primitives == true) {
    jump_short_if_arg_does_not_point_to_flonum(code,RAX,R11,&error);
    local_f8[0] = 0x4a;
    local_fc = R11;
    assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
              (code,local_f8,&local_fc);
  }
  local_f8[0] = XMM0;
  local_f8[2] = 0x19;
  local_f8[3] = 8;
  local_fc = oVar2;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_f8,&local_fc,local_f8 + 2,(int *)(local_f8 + 3));
  fix2int(code,RBX);
  local_f8[0] = RCX;
  local_fc = XMM1;
  local_f8[2] = 10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_f8,&local_fc,local_f8 + 2);
  int2fix(code,RBX);
  local_f8[0] = XMM13|RCX;
  local_fc = XMM0;
  local_f8[2] = 0x44;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_f8,&local_fc,local_f8 + 2);
  local_f8[0] = BYTE_MEM_R13;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>(code,local_f8,&done);
  local_f8[0] = XMM0;
  local_f8[2] = 0x44;
  local_fc = oVar2;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_f8,&local_fc,local_f8 + 2);
  local_f8[0] = ST4;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>(code,local_f8,&done);
  local_f8[0] = ST6;
  local_fc = RAX;
  local_f8[2] = 0x23;
  local_f8[3] = 0x98;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_f8,&local_fc,local_f8 + 2,(int *)(local_f8 + 3));
  local_f8[0] = XMM0;
  local_fc = MEM_RAX;
  local_f8[2] = 8;
  local_f8[3] = oVar2;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,local_f8,&local_fc,(int *)(local_f8 + 2),local_f8 + 3);
  local_f8[0] = ST6;
  local_fc = RAX;
  local_f8[2] = 0x23;
  local_f8[3] = 0x98;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_f8,&local_fc,local_f8 + 2,(int *)(local_f8 + 3));
  local_f8[0] = XMM6;
  local_fc = RAX;
  local_f8[2] = 0x39;
  local_f8[3] = 5;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_f8,&local_fc,local_f8 + 2,(int *)(local_f8 + 3));
  local_f8[0] = 0x4c;
  assembler::asmcode::add<assembler::asmcode::operation>(code,local_f8);
  if (ops->safe_primitives == true) {
    error_label(code,&error,re_max_contract_violation);
  }
  std::__cxx11::string::~string((string *)&done_fx);
  std::__cxx11::string::~string((string *)&error);
  std::__cxx11::string::~string((string *)&done);
  std::__cxx11::string::~string((string *)&l3);
  std::__cxx11::string::~string((string *)&l2);
  std::__cxx11::string::~string((string *)&l1);
  return;
}

Assistant:

void compile_max_2(asmcode& code, const compiler_options& ops)
  {
  code.add(asmcode::LABEL, "L_max_2");
  auto l1 = label_to_string(label++);
  auto l2 = label_to_string(label++);
  auto l3 = label_to_string(label++);
  auto done = label_to_string(label++);
  std::string error;
  if (ops.safe_primitives)
    error = label_to_string(label++);
  code.add(asmcode::TEST, asmcode::RAX, asmcode::NUMBER, 1);
  if (ops.safe_primitives)
    code.add(asmcode::JE, l1);
  else
    code.add(asmcode::JES, l1); // rax is fixnum
  //rax is flonum
  code.add(asmcode::TEST, asmcode::RBX, asmcode::NUMBER, 1);
  if (ops.safe_primitives)
    code.add(asmcode::JE, l3); // rax is flonum and rbx is fixnum
  else
    code.add(asmcode::JES, l3); // rax is flonum and rbx is fixnum
  // rax and rbx are flonum
  // here check whether they are a block
  if (ops.safe_primitives)
    {
    code.add(asmcode::PUSH, asmcode::R11);
    jump_if_arg_is_not_block(code, asmcode::RAX, asmcode::R11, error);
    jump_if_arg_is_not_block(code, asmcode::RBX, asmcode::R11, error);
    }
  code.add(asmcode::AND, asmcode::RAX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  code.add(asmcode::AND, asmcode::RBX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  // check whether they contain flonums
  if (ops.safe_primitives)
    {
    jump_if_arg_does_not_point_to_flonum(code, asmcode::RAX, asmcode::R11, error);
    jump_if_arg_does_not_point_to_flonum(code, asmcode::RBX, asmcode::R11, error);
    code.add(asmcode::POP, asmcode::R11);
    }
  code.add(asmcode::MOVSD, asmcode::XMM0, asmcode::MEM_RAX, CELLS(1));
  code.add(asmcode::MOVSD, asmcode::XMM1, asmcode::MEM_RBX, CELLS(1));
  code.add(asmcode::UCOMISD, asmcode::XMM0, asmcode::XMM1);
  if (ops.safe_primitives)
    code.add(asmcode::JA, done);
  else
    code.add(asmcode::JAS, done);
  code.add(asmcode::MOVSD, asmcode::XMM0, asmcode::XMM1);
  if (ops.safe_primitives)
    code.add(asmcode::JMP, done);
  else
    code.add(asmcode::JMPS, done);
  code.add(asmcode::LABEL, l1);
  code.add(asmcode::TEST, asmcode::RBX, asmcode::NUMBER, 1);
  code.add(asmcode::JES, l2); // rax and rbx are fixnum
  // rax is fixnum and rbx is flonum
  fix2int(code, asmcode::RAX);
  code.add(asmcode::CVTSI2SD, asmcode::XMM0, asmcode::RAX);
  // here check whether RBX is a block
  if (ops.safe_primitives)
    {
    code.add(asmcode::PUSH, asmcode::R11);
    jump_if_arg_is_not_block(code, asmcode::RBX, asmcode::R11, error);
    }
  code.add(asmcode::AND, asmcode::RBX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  if (ops.safe_primitives)
    {
    jump_if_arg_does_not_point_to_flonum(code, asmcode::RBX, asmcode::R11, error);
    code.add(asmcode::POP, asmcode::R11);
    }
  code.add(asmcode::MOVSD, asmcode::XMM1, asmcode::MEM_RBX, CELLS(1));
  code.add(asmcode::UCOMISD, asmcode::XMM0, asmcode::XMM1);
  code.add(asmcode::JAS, done);
  code.add(asmcode::MOVSD, asmcode::XMM0, asmcode::XMM1);
  code.add(asmcode::JMPS, done);
  code.add(asmcode::LABEL, l2);
  code.add(asmcode::CMP, asmcode::RAX, asmcode::RBX);
  auto done_fx = label_to_string(label++);
  code.add(asmcode::JGS, done_fx);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::RBX);
  code.add(asmcode::LABEL, done_fx);
  code.add(asmcode::RET);
  code.add(asmcode::JMPS, done);

  code.add(asmcode::LABEL, l3);
  // rax is flonum and rbx is fixnum
  // here check whether RAX is a block
  if (ops.safe_primitives)
    {
    code.add(asmcode::PUSH, asmcode::R11);
    jump_short_if_arg_is_not_block(code, asmcode::RAX, asmcode::R11, error);
    }
  code.add(asmcode::AND, asmcode::RAX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  if (ops.safe_primitives)
    {
    jump_short_if_arg_does_not_point_to_flonum(code, asmcode::RAX, asmcode::R11, error);
    code.add(asmcode::POP, asmcode::R11);
    }
  code.add(asmcode::MOVSD, asmcode::XMM0, asmcode::MEM_RAX, CELLS(1));
  fix2int(code, asmcode::RBX);
  code.add(asmcode::CVTSI2SD, asmcode::XMM1, asmcode::RBX);
  int2fix(code, asmcode::RBX);
  code.add(asmcode::UCOMISD, asmcode::XMM0, asmcode::XMM1);
  code.add(asmcode::JAS, done);
  code.add(asmcode::MOVSD, asmcode::XMM0, asmcode::XMM1);
  //code.add(asmcode::JMPS, done);
  code.add(asmcode::LABEL, done);
  code.add(asmcode::MOV, asmcode::RAX, TEMP_FLONUM);
  code.add(asmcode::MOVSD, asmcode::MEM_RAX, CELLS(1), asmcode::XMM0);
  code.add(asmcode::MOV, asmcode::RAX, TEMP_FLONUM);
  code.add(asmcode::OR, asmcode::RAX, asmcode::NUMBER, block_tag);
  code.add(asmcode::RET);
  if (ops.safe_primitives)
    {
    error_label(code, error, re_max_contract_violation);
    }
  }